

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::createCaseGroup
               (TestCaseGroup *parent,char *groupName,char *groupDesc,TexFuncCaseSpec *cases,
               int numCases)

{
  TestContext *pTVar1;
  ShaderTextureFunctionCase *pSVar2;
  long *plVar3;
  size_type *psVar4;
  ulong uVar5;
  deUint32 *pdVar6;
  undefined4 uVar7;
  long lVar8;
  deUint32 *pdVar9;
  string local_e8;
  ShaderTextureFunctionCase *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  TestNode *local_a0;
  TestNode *local_98;
  TextureLookupSpec *local_90;
  string local_88;
  undefined4 local_64;
  string name;
  
  uVar5 = (ulong)(uint)numCases;
  local_a0 = (TestNode *)operator_new(0x70);
  local_98 = &parent->super_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_a0,(parent->super_TestNode).m_testCtx,groupName,groupDesc);
  if (0 < numCases) {
    pdVar9 = &cases->flags;
    lVar8 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,((TexFuncCaseSpec *)(pdVar9 + -0x36))->name,
                 (allocator<char> *)&local_e8);
      local_90 = (TextureLookupSpec *)(pdVar9 + -0x34);
      if (((((TextureLookupSpec *)(pdVar9 + -0x34))->function - FUNCTION_TEXTUREPROJGRAD < 3) ||
          ((((TextureLookupSpec *)(pdVar9 + -0x34))->function & ~FUNCTION_TEXTURELOD) -
           FUNCTION_TEXTUREPROJ < 3)) ||
         ((((TextureSpec *)(pdVar9 + -0x18))->type < TEXTURETYPE_LAST &&
          ((0x51U >> (((TextureSpec *)(pdVar9 + -0x18))->type & 0x1f) & 1) != 0)))) {
        if ((*pdVar9 & 1) != 0) {
          uVar7 = 0;
          pdVar6 = &cases[lVar8].flags;
          goto LAB_0062dc28;
        }
        if ((*pdVar9 & 2) == 0) goto LAB_0062dfdc;
LAB_0062deef:
        local_c8 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
        pTVar1 = local_98->m_testCtx;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        std::__cxx11::string::append((char *)&local_e8);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
        pSVar2 = local_c8;
        ShaderTextureFunctionCase::ShaderTextureFunctionCase
                  (local_c8,pTVar1,&local_e8,&local_c0,local_90,(TextureSpec *)(pdVar9 + -0x18),
                   *(TexEvalFunc *)(pdVar9 + -2),false);
        tcu::TestNode::addChild(local_a0,(TestNode *)pSVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      else if ((*pdVar9 & 1) == 0) {
        if ((*pdVar9 & 2) != 0) {
LAB_0062dd49:
          local_c8 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
          pTVar1 = local_98->m_testCtx;
          std::operator+(&local_c0,"sparse_",&name);
          pSVar2 = local_c8;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          psVar4 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar4) {
            local_e8.field_2._M_allocated_capacity = *psVar4;
            local_e8.field_2._8_4_ = (undefined4)plVar3[3];
            local_e8.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar4;
            local_e8._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_e8._M_string_length = plVar3[1];
          *plVar3 = (long)psVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
          SparseShaderTextureFunctionCase::SparseShaderTextureFunctionCase
                    ((SparseShaderTextureFunctionCase *)pSVar2,pTVar1,&local_e8,&local_88,local_90,
                     (TextureSpec *)(pdVar9 + -0x18),*(TexEvalFunc *)(pdVar9 + -2),false);
          tcu::TestNode::addChild(local_a0,(TestNode *)pSVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0062deef;
        }
      }
      else {
        local_c8 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
        pTVar1 = local_98->m_testCtx;
        std::operator+(&local_c0,"sparse_",&name);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_e8.field_2._M_allocated_capacity = *psVar4;
          local_e8.field_2._8_4_ = (undefined4)plVar3[3];
          local_e8.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar4;
          local_e8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_e8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
        pSVar2 = local_c8;
        SparseShaderTextureFunctionCase::SparseShaderTextureFunctionCase
                  ((SparseShaderTextureFunctionCase *)local_c8,pTVar1,&local_e8,&local_88,local_90,
                   (TextureSpec *)(pdVar9 + -0x18),*(TexEvalFunc *)(pdVar9 + -2),true);
        tcu::TestNode::addChild(local_a0,(TestNode *)pSVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        uVar7 = (undefined4)CONCAT71((int7)((ulong)&local_c0 >> 8),1);
        pdVar6 = pdVar9;
LAB_0062dc28:
        local_c8 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
        pTVar1 = local_98->m_testCtx;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        local_64 = uVar7;
        std::__cxx11::string::append((char *)&local_e8);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
        pSVar2 = local_c8;
        ShaderTextureFunctionCase::ShaderTextureFunctionCase
                  (local_c8,pTVar1,&local_e8,&local_c0,local_90,(TextureSpec *)(pdVar9 + -0x18),
                   *(TexEvalFunc *)(pdVar9 + -2),true);
        tcu::TestNode::addChild(local_a0,(TestNode *)pSVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((*pdVar6 & 2) != 0) {
          if ((char)local_64 != '\0') goto LAB_0062dd49;
          goto LAB_0062deef;
        }
      }
LAB_0062dfdc:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar8 = lVar8 + 1;
      pdVar9 = pdVar9 + 0x38;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  tcu::TestNode::addChild(local_98,local_a0);
  return;
}

Assistant:

static void createCaseGroup (tcu::TestCaseGroup* parent, const char* groupName, const char* groupDesc, const TexFuncCaseSpec* cases, int numCases)
{
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(parent->getTestContext(), groupName, groupDesc));

	for (int ndx = 0; ndx < numCases; ndx++)
	{
		std::string	name			= cases[ndx].name;
		bool		sparseSupported	= !functionHasProj(cases[ndx].lookupSpec.function)		&&
									  TEXTURETYPE_1D			!= cases[ndx].texSpec.type	&&
									  TEXTURETYPE_1D_ARRAY		!= cases[ndx].texSpec.type	&&
									  TEXTURETYPE_CUBE_ARRAY	!= cases[ndx].texSpec.type;

		if (cases[ndx].flags & VERTEX)
		{
			if (sparseSupported)
				group->addChild(new SparseShaderTextureFunctionCase(parent->getTestContext(), ("sparse_" + name + "_vertex"),   "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, true ));

			group->addChild(new ShaderTextureFunctionCase(parent->getTestContext(), (name + "_vertex"),   "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, true ));
		}

		if (cases[ndx].flags & FRAGMENT)
		{
			if (sparseSupported)
				group->addChild(new SparseShaderTextureFunctionCase(parent->getTestContext(), ("sparse_" + name + "_fragment"), "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, false));

			group->addChild(new ShaderTextureFunctionCase(parent->getTestContext(), (name + "_fragment"), "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, false));
		}
	}

	parent->addChild(group.release());
}